

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
::load(string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       *this,handle src,bool param_3)

{
  enable_if_t<std::is_same<char,_char>::value,_handle> src_00;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  PyObject **ppPVar4;
  char *pcVar5;
  byte in_DL;
  handle in_RSI;
  string *in_RDI;
  CharT *buffer;
  Py_ssize_t size;
  handle load_src;
  allocator local_61;
  string local_60 [32];
  char *local_40;
  ulong local_38;
  PyObject *local_30;
  handle local_28;
  byte local_19;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  local_19 = in_DL & 1;
  local_28.m_ptr = in_RSI.m_ptr;
  bVar2 = pybind11::handle::operator_cast_to_bool((handle *)&stack0xfffffffffffffff0);
  if (bVar2) {
    ppPVar4 = pybind11::handle::ptr(&local_28);
    iVar3 = PyType_HasFeature((*ppPVar4)->ob_type,0x10000000);
    if (iVar3 == 0) {
      local_30 = local_28.m_ptr;
      src_00.m_ptr._7_1_ = in_stack_ffffffffffffffff;
      src_00.m_ptr._0_7_ = in_stack_fffffffffffffff8;
      bVar2 = load_raw<char>((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                              *)in_RSI.m_ptr,src_00);
    }
    else {
      local_38 = 0xffffffffffffffff;
      ppPVar4 = pybind11::handle::ptr(&local_28);
      pcVar5 = (char *)PyUnicode_AsUTF8AndSize(*ppPVar4,&local_38);
      uVar1 = local_38;
      local_40 = pcVar5;
      if (pcVar5 == (char *)0x0) {
        PyErr_Clear();
        bVar2 = false;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_60,pcVar5,uVar1,&local_61);
        std::__cxx11::string::operator=(in_RDI,local_60);
        std::__cxx11::string::~string(local_60);
        std::allocator<char>::~allocator((allocator<char> *)&local_61);
        bVar2 = true;
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool load(handle src, bool) {
        handle load_src = src;
        if (!src) {
            return false;
        }
        if (!PyUnicode_Check(load_src.ptr())) {
            return load_raw(load_src);
        }

        // For UTF-8 we avoid the need for a temporary `bytes` object by using
        // `PyUnicode_AsUTF8AndSize`.
        if (UTF_N == 8) {
            Py_ssize_t size = -1;
            const auto *buffer
                = reinterpret_cast<const CharT *>(PyUnicode_AsUTF8AndSize(load_src.ptr(), &size));
            if (!buffer) {
                PyErr_Clear();
                return false;
            }
            value = StringType(buffer, static_cast<size_t>(size));
            return true;
        }

        auto utfNbytes
            = reinterpret_steal<object>(PyUnicode_AsEncodedString(load_src.ptr(),
                                                                  UTF_N == 8    ? "utf-8"
                                                                  : UTF_N == 16 ? "utf-16"
                                                                                : "utf-32",
                                                                  nullptr));
        if (!utfNbytes) {
            PyErr_Clear();
            return false;
        }

        const auto *buffer
            = reinterpret_cast<const CharT *>(PYBIND11_BYTES_AS_STRING(utfNbytes.ptr()));
        size_t length = (size_t) PYBIND11_BYTES_SIZE(utfNbytes.ptr()) / sizeof(CharT);
        // Skip BOM for UTF-16/32
        if (UTF_N > 8) {
            buffer++;
            length--;
        }
        value = StringType(buffer, length);

        // If we're loading a string_view we need to keep the encoded Python object alive:
        if (IsView) {
            loader_life_support::add_patient(utfNbytes);
        }

        return true;
    }